

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

ISAKind __thiscall llvm::ARM::parseArchISA(ARM *this,StringRef Arch)

{
  bool bVar1;
  ISAKind *pIVar2;
  StringLiteral local_250;
  StringLiteral local_240;
  StringLiteral local_230;
  StringLiteral local_220;
  ARM *local_210;
  char *local_208;
  ARM *local_200;
  char *local_1f8;
  Optional<llvm::ARM::ISAKind> OStack_1f0;
  ARM *local_1e8;
  StringRef Arch_local;
  ISAKind local_1ac;
  ARM **local_1a8;
  char *local_1a0;
  char *local_198;
  ARM **local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  ISAKind local_164;
  ARM **local_160;
  char *local_158;
  char *local_150;
  ARM **local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  ISAKind local_11c;
  ARM **local_118;
  char *local_110;
  char *local_108;
  ARM **local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  ISAKind local_d4;
  ARM **local_d0;
  char *local_c8;
  char *local_c0;
  ARM **local_b8;
  char *local_b0;
  char *local_a8;
  ISAKind local_9c;
  ARM **local_98;
  ISAKind local_8c;
  char *local_88;
  char *local_80;
  ARM *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  ARM *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  ARM *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  ARM *local_18;
  int local_c;
  
  local_208 = Arch.Data;
  Arch_local.Length = (size_t)&local_200;
  local_210 = this;
  local_1e8 = this;
  Arch_local.Data = local_208;
  local_200 = this;
  local_1f8 = local_208;
  Optional<llvm::ARM::ISAKind>::Optional(&OStack_1f0);
  StringLiteral::StringLiteral<8UL>(&local_220,(char (*) [8])"aarch64");
  local_c8 = local_220.super_StringRef.Data;
  local_c0 = (char *)local_220.super_StringRef.Length;
  local_d4 = AARCH64;
  local_d0 = &local_200;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1f0);
  if (!bVar1) {
    local_e8 = local_c8;
    local_e0 = local_c0;
    local_b0 = local_c8;
    local_a8 = local_c0;
    bVar1 = false;
    local_b8 = &local_200;
    if (local_c0 <= local_1f8) {
      local_78 = local_200;
      local_80 = local_c8;
      local_88 = local_c0;
      if (local_c0 == (char *)0x0) {
        local_6c = 0;
      }
      else {
        local_6c = memcmp(local_200,local_c8,(size_t)local_c0);
      }
      bVar1 = local_6c == 0;
    }
    if (bVar1) {
      Optional<llvm::ARM::ISAKind>::operator=(&OStack_1f0,&local_d4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_230,(char (*) [6])"arm64");
  local_110 = local_230.super_StringRef.Data;
  local_108 = (char *)local_230.super_StringRef.Length;
  local_11c = AARCH64;
  local_118 = &local_200;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1f0);
  if (!bVar1) {
    local_130 = local_110;
    local_128 = local_108;
    local_f8 = local_110;
    local_f0 = local_108;
    bVar1 = false;
    local_100 = &local_200;
    if (local_108 <= local_1f8) {
      local_58 = local_200;
      local_60 = local_110;
      local_68 = local_108;
      if (local_108 == (char *)0x0) {
        local_4c = 0;
      }
      else {
        local_4c = memcmp(local_200,local_110,(size_t)local_108);
      }
      bVar1 = local_4c == 0;
    }
    if (bVar1) {
      Optional<llvm::ARM::ISAKind>::operator=(&OStack_1f0,&local_11c);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_240,(char (*) [6])0x293e9d);
  local_158 = local_240.super_StringRef.Data;
  local_150 = (char *)local_240.super_StringRef.Length;
  local_164 = THUMB;
  local_160 = &local_200;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1f0);
  if (!bVar1) {
    local_178 = local_158;
    local_170 = local_150;
    local_140 = local_158;
    local_138 = local_150;
    bVar1 = false;
    local_148 = &local_200;
    if (local_150 <= local_1f8) {
      local_38 = local_200;
      local_40 = local_158;
      local_48 = local_150;
      if (local_150 == (char *)0x0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(local_200,local_158,(size_t)local_150);
      }
      bVar1 = local_2c == 0;
    }
    if (bVar1) {
      Optional<llvm::ARM::ISAKind>::operator=(&OStack_1f0,&local_164);
    }
  }
  StringLiteral::StringLiteral<4UL>(&local_250,(char (*) [4])0x293ee1);
  local_1a0 = local_250.super_StringRef.Data;
  local_198 = (char *)local_250.super_StringRef.Length;
  local_1ac = ARM;
  local_1a8 = &local_200;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1f0);
  if (!bVar1) {
    local_188 = local_1a0;
    local_180 = local_198;
    bVar1 = false;
    local_190 = &local_200;
    if (local_198 <= local_1f8) {
      local_18 = local_200;
      local_20 = local_1a0;
      local_28 = local_198;
      if (local_198 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_200,local_1a0,(size_t)local_198);
      }
      bVar1 = local_c == 0;
    }
    if (bVar1) {
      Optional<llvm::ARM::ISAKind>::operator=(&OStack_1f0,&local_1ac);
    }
  }
  local_9c = INVALID;
  local_98 = &local_200;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1f0);
  if (bVar1) {
    pIVar2 = Optional<llvm::ARM::ISAKind>::operator*(&OStack_1f0);
    local_8c = *pIVar2;
  }
  else {
    local_8c = local_9c;
  }
  return local_8c;
}

Assistant:

ARM::ISAKind ARM::parseArchISA(StringRef Arch) {
  return StringSwitch<ARM::ISAKind>(Arch)
      .StartsWith("aarch64", ARM::ISAKind::AARCH64)
      .StartsWith("arm64", ARM::ISAKind::AARCH64)
      .StartsWith("thumb", ARM::ISAKind::THUMB)
      .StartsWith("arm", ARM::ISAKind::ARM)
      .Default(ARM::ISAKind::INVALID);
}